

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O1

void __thiscall
tchecker::clockbounds::local_m_map_t::resize
          (local_m_map_t *this,loc_id_t loc_nb,clock_id_t clock_nb)

{
  make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_> *pmVar1;
  map_t *pmVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  value_type local_20;
  
  clear(this);
  this->_loc_nb = loc_nb;
  this->_clock_nb = clock_nb;
  local_20 = (value_type)0x0;
  std::
  vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
  ::resize(&this->_M,(ulong)loc_nb,&local_20);
  if (this->_loc_nb != 0) {
    uVar5 = 0;
    do {
      pmVar2 = allocate_map((ulong)this->_clock_nb);
      (this->_M).
      super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar5] = pmVar2;
      pmVar1 = (this->_M).
               super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar5];
      uVar3 = (ulong)(pmVar1->super_array_capacity_t<unsigned_int>)._capacity;
      if (uVar3 != 0) {
        uVar4 = 0;
        do {
          (&pmVar1->_fam)[uVar4] = (no_storage_array_t<int>)0xc0000001;
          uVar4 = uVar4 + 1;
        } while (uVar3 != uVar4);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->_loc_nb);
  }
  return;
}

Assistant:

void local_m_map_t::resize(tchecker::loc_id_t loc_nb, tchecker::clock_id_t clock_nb)
{
  clear();

  _loc_nb = loc_nb;
  _clock_nb = clock_nb;
  _M.resize(_loc_nb, nullptr);
  for (tchecker::loc_id_t id = 0; id < _loc_nb; ++id) {
    _M[id] = tchecker::clockbounds::allocate_map(_clock_nb);
    tchecker::clockbounds::clear(*_M[id]);
  }
}